

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O2

MPP_RET dec_vproc_set_dei_v2(MppDecVprocCtx *vproc_ctx,MppFrame frm)

{
  IEP2_DIL_MODE IVar1;
  RK_U32 RVar2;
  uint uVar3;
  bool bVar4;
  
  if (*(int *)(vproc_ctx + 0x19) == 1) {
    RVar2 = mpp_frame_get_mode(frm);
    if ((RVar2 & 0xf) == 0) {
      dec_vproc_output_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,1);
      return MPP_OK;
    }
    if (vproc_ctx[0x15] == (MppDecVprocCtx)0x0) {
      if (vproc_ctx[0x13] != (MppDecVprocCtx)0x0) {
        if (((byte)vproc_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_dec_vproc","Wait for next frame to turn into I5O2",
                     "dec_vproc_dei_v2_deinterlace");
        }
        if (vproc_ctx[0x17] != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller(vproc_ctx[0x17],"dec_vproc_dei_v2_deinterlace");
          vproc_ctx[0x17] = (MppDecVprocCtx)0x0;
        }
        if (vproc_ctx[0x18] != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller(vproc_ctx[0x18],"dec_vproc_dei_v2_deinterlace");
          vproc_ctx[0x18] = (MppDecVprocCtx)0x0;
          return MPP_OK;
        }
        return MPP_OK;
      }
    }
    else if (vproc_ctx[0x13] != (MppDecVprocCtx)0x0) {
      if (((byte)vproc_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_dec_vproc","5 field in and 2 frame out\n","dec_vproc_dei_v2_deinterlace");
      }
      IVar1 = IEP2_DIL_MODE_PD;
      if (*(int *)((long)vproc_ctx + 0xb4) == 0) {
        IVar1 = IEP2_DIL_MODE_I5O2;
      }
      dec_vproc_config_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,IVar1);
      mpp_frame_set_mode(frm,RVar2 | 0x200);
      (*(code *)vproc_ctx[0x1b])(vproc_ctx,RVar2 | 0x200);
      dec_vproc_output_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,0);
      if (*(int *)(vproc_ctx + 0x10) != 4) {
        *(undefined4 *)((long)vproc_ctx + 0xb4) = 1;
        return MPP_OK;
      }
      *(undefined4 *)((long)vproc_ctx + 0xb4) = 0;
      return MPP_OK;
    }
    if (((byte)vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","2 field in and 1 frame out\n","dec_vproc_dei_v2_deinterlace");
    }
    dec_vproc_config_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,IEP2_DIL_MODE_I1O1T);
    mpp_frame_set_mode(frm,RVar2 | 0x100);
    (*(code *)vproc_ctx[0x1b])(vproc_ctx,RVar2 | 0x100);
    dec_vproc_output_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,0);
    return MPP_OK;
  }
  if (*(int *)(vproc_ctx + 0x19) != 2) {
    _mpp_log_l(2,"mpp_dec_vproc","warning: vproc mode unknown!\n",(char *)0x0);
    return MPP_NOK;
  }
  RVar2 = mpp_frame_get_mode(frm);
  uVar3 = RVar2 & 0xf;
  if (*(uint *)(vproc_ctx + 0x16) != 2) {
    uVar3 = *(uint *)(vproc_ctx + 0x16);
  }
  bVar4 = uVar3 == 0;
  if (vproc_ctx[0x15] == (MppDecVprocCtx)0x0) {
    if (vproc_ctx[0x13] != (MppDecVprocCtx)0x0) {
      if (((byte)vproc_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_dec_vproc","Wait for next frame to turn into I5O2",
                   "dec_vproc_dei_v2_detection");
      }
      if (vproc_ctx[0x17] != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(vproc_ctx[0x17],"dec_vproc_dei_v2_detection");
        vproc_ctx[0x17] = (MppDecVprocCtx)0x0;
      }
      if (vproc_ctx[0x18] != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(vproc_ctx[0x18],"dec_vproc_dei_v2_detection");
        vproc_ctx[0x18] = (MppDecVprocCtx)0x0;
      }
      goto LAB_00176b8b;
    }
  }
  else if (vproc_ctx[0x13] != (MppDecVprocCtx)0x0) {
    if (((byte)vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","5 field in and 2 frame out\n","dec_vproc_dei_v2_detection");
    }
    IVar1 = IEP2_DIL_MODE_PD;
    if (*(int *)((long)vproc_ctx + 0xb4) == 0) {
      IVar1 = IEP2_DIL_MODE_I5O2;
    }
    dec_vproc_config_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,IVar1);
    (*(code *)vproc_ctx[0x1b])(vproc_ctx,RVar2);
    if (*(int *)((long)vproc_ctx + 0x7c) == 0) {
      bVar4 = true;
    }
    else {
      *(uint *)((long)vproc_ctx + 0xb4) = (uint)(*(int *)(vproc_ctx + 0x10) != 4);
      mpp_frame_set_mode(frm,RVar2 | 0x200);
      bVar4 = false;
    }
    goto LAB_00176b8b;
  }
  if (((byte)vproc_debug & 2) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","2 field in and 1 frame out\n","dec_vproc_dei_v2_detection");
  }
  dec_vproc_config_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,IEP2_DIL_MODE_I1O1T);
  mpp_frame_set_mode(frm,RVar2 | 0x100);
  (*(code *)vproc_ctx[0x1b])(vproc_ctx,RVar2 | 0x100);
LAB_00176b8b:
  dec_vproc_output_dei_v2((MppDecVprocCtxImpl *)vproc_ctx,frm,(uint)bVar4);
  *(undefined4 *)(vproc_ctx + 0x16) = *(undefined4 *)((long)vproc_ctx + 0x7c);
  return MPP_OK;
}

Assistant:

static MPP_RET dec_vproc_set_dei_v2(MppDecVprocCtx *vproc_ctx, MppFrame frm)
{
    MPP_RET ret = MPP_OK;
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)vproc_ctx;
    /*     RK_U32 mode = mpp_frame_get_mode(frm);
        enum IEP2_DIL_MODE dil_mode = IEP2_DIL_MODE_DISABLE; */
    MppVprocMode vproc_mode = ctx->vproc_mode;

    switch (vproc_mode) {
    case MPP_VPROC_MODE_DETECTION: {
        dec_vproc_dei_v2_detection(ctx, frm);
    } break;
    case MPP_VPROC_MODE_DEINTELACE: {
        dec_vproc_dei_v2_deinterlace(ctx, frm);
    } break;
    default: {
        mpp_err("warning: vproc mode unknown!\n");
        ret = MPP_NOK;
    } break;
    }

    return ret;
}